

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall BackwardPass::TrackBitWiseOrNumberOp(BackwardPass *this,Instr *instr)

{
  OpCode opcode_00;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  BOOLEAN BVar4;
  undefined4 *puVar5;
  Opnd *pOVar6;
  StackSym *pSVar7;
  StackSym *dstSym;
  OpCode opcode;
  bool trackNumberop;
  bool trackBitWiseop;
  Instr *instr_local;
  BackwardPass *this_local;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x198b,"(instr)","instr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = DoTrackBitOpsOrNumber(this);
  opcode_00 = instr->m_opcode;
  pOVar6 = IR::Instr::GetDst(instr);
  pSVar7 = IR::RegOpnd::TryGetStackSym(pOVar6);
  if (((bVar2) || (bVar2)) && (bVar3 = IR::Instr::IsRealInstr(instr), bVar3)) {
    if (pSVar7 != (StackSym *)0x0) {
      if ((bVar2) &&
         (BVar4 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                            (this->symUsedOnlyForBitOpsBySymId,(pSVar7->super_Sym).m_id),
         BVar4 != '\0')) {
        *(ushort *)&instr->field_0x36 = *(ushort *)&instr->field_0x36 & 0xbfff | 0x4000;
      }
      if ((bVar2) &&
         (BVar4 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                            (this->symUsedOnlyForNumberBySymId,(pSVar7->super_Sym).m_id),
         BVar4 != '\0')) {
        *(ushort *)&instr->field_0x36 = *(ushort *)&instr->field_0x36 & 0x7fff | 0x8000;
      }
    }
    bVar3 = OpCodeAttr::NonTempNumberSources(opcode_00);
    if (bVar3) {
      if (bVar2) {
        pOVar6 = IR::Instr::GetSrc1(instr);
        SetSymIsNotUsedOnlyInBitOps(this,pOVar6);
        pOVar6 = IR::Instr::GetSrc2(instr);
        SetSymIsNotUsedOnlyInBitOps(this,pOVar6);
        pOVar6 = IR::Instr::GetSrc1(instr);
        SetSymIsNotUsedOnlyInNumber(this,pOVar6);
        pOVar6 = IR::Instr::GetSrc2(instr);
        SetSymIsNotUsedOnlyInNumber(this,pOVar6);
      }
    }
    else {
      if (bVar2) {
        if ((((opcode_00 == Not_A) || ((ushort)(opcode_00 - And_A) < 5)) || (opcode_00 == Not_I4))
           || ((ushort)(opcode_00 - And_I4) < 5)) {
          pOVar6 = IR::Instr::GetSrc1(instr);
          SetSymIsUsedOnlyInBitOpsIfLastUse(this,pOVar6);
          pOVar6 = IR::Instr::GetSrc2(instr);
          SetSymIsUsedOnlyInBitOpsIfLastUse(this,pOVar6);
        }
        else {
          pOVar6 = IR::Instr::GetSrc1(instr);
          SetSymIsNotUsedOnlyInBitOps(this,pOVar6);
          pOVar6 = IR::Instr::GetSrc2(instr);
          SetSymIsNotUsedOnlyInBitOps(this,pOVar6);
        }
      }
      if (bVar2) {
        if ((((((ushort)(opcode_00 - Incr_A) < 4) || (opcode_00 == Div_A)) ||
             (((ushort)(opcode_00 - Mul_A) < 2 ||
              ((opcode_00 == Sub_A || ((ushort)(opcode_00 - And_A) < 6)))))) ||
            (opcode_00 == Conv_Num)) || (opcode_00 == ShrU_I4)) {
          pOVar6 = IR::Instr::GetSrc1(instr);
          SetSymIsUsedOnlyInNumberIfLastUse(this,pOVar6);
          pOVar6 = IR::Instr::GetSrc2(instr);
          SetSymIsUsedOnlyInNumberIfLastUse(this,pOVar6);
        }
        else {
          pOVar6 = IR::Instr::GetSrc1(instr);
          SetSymIsNotUsedOnlyInNumber(this,pOVar6);
          pOVar6 = IR::Instr::GetSrc2(instr);
          SetSymIsNotUsedOnlyInNumber(this,pOVar6);
        }
      }
    }
  }
  return;
}

Assistant:

void
BackwardPass::TrackBitWiseOrNumberOp(IR::Instr *const instr)
{
    Assert(instr);
    const bool trackBitWiseop = DoTrackBitOpsOrNumber();
    const bool trackNumberop = trackBitWiseop;
    const Js::OpCode opcode = instr->m_opcode;
    StackSym *const dstSym = IR::RegOpnd::TryGetStackSym(instr->GetDst());
    if (!trackBitWiseop && !trackNumberop)
    {
        return;
    }

    if (!instr->IsRealInstr())
    {
        return;
    }

    if (dstSym)
    {
        // For a dst where the def is in this block, transfer the current info into the instruction
        if (trackBitWiseop && symUsedOnlyForBitOpsBySymId->TestAndClear(dstSym->m_id))
        {
            instr->dstIsAlwaysConvertedToInt32 = true;
        }
        if (trackNumberop && symUsedOnlyForNumberBySymId->TestAndClear(dstSym->m_id))
        {
            instr->dstIsAlwaysConvertedToNumber = true;
        }
    }

    // If the instruction can cause src values to escape the local scope, the srcs can't be optimized
    if (OpCodeAttr::NonTempNumberSources(opcode))
    {
        if (trackBitWiseop)
        {
            SetSymIsNotUsedOnlyInBitOps(instr->GetSrc1());
            SetSymIsNotUsedOnlyInBitOps(instr->GetSrc2());
        }
        if (trackNumberop)
        {
            SetSymIsNotUsedOnlyInNumber(instr->GetSrc1());
            SetSymIsNotUsedOnlyInNumber(instr->GetSrc2());
        }
        return;
    }

    if (trackBitWiseop)
    {
        switch (opcode)
        {
            // Instructions that can cause src values to escape the local scope have already been excluded

        case Js::OpCode::Not_A:
        case Js::OpCode::And_A:
        case Js::OpCode::Or_A:
        case Js::OpCode::Xor_A:
        case Js::OpCode::Shl_A:
        case Js::OpCode::Shr_A:

        case Js::OpCode::Not_I4:
        case Js::OpCode::And_I4:
        case Js::OpCode::Or_I4:
        case Js::OpCode::Xor_I4:
        case Js::OpCode::Shl_I4:
        case Js::OpCode::Shr_I4:
            // These instructions don't generate -0, and their behavior is the same for any src that is -0 or +0
            SetSymIsUsedOnlyInBitOpsIfLastUse(instr->GetSrc1());
            SetSymIsUsedOnlyInBitOpsIfLastUse(instr->GetSrc2());
            break;
        default:
            SetSymIsNotUsedOnlyInBitOps(instr->GetSrc1());
            SetSymIsNotUsedOnlyInBitOps(instr->GetSrc2());
            break;
        }
    }

    if (trackNumberop)
    {
        switch (opcode)
        {
            // Instructions that can cause src values to escape the local scope have already been excluded

        case Js::OpCode::Conv_Num:
        case Js::OpCode::Div_A:
        case Js::OpCode::Mul_A:
        case Js::OpCode::Sub_A:
        case Js::OpCode::Rem_A:
        case Js::OpCode::Incr_A:
        case Js::OpCode::Decr_A:
        case Js::OpCode::Neg_A:
        case Js::OpCode::Not_A:
        case Js::OpCode::ShrU_A:
        case Js::OpCode::ShrU_I4:
        case Js::OpCode::And_A:
        case Js::OpCode::Or_A:
        case Js::OpCode::Xor_A:
        case Js::OpCode::Shl_A:
        case Js::OpCode::Shr_A:
            // These instructions don't generate -0, and their behavior is the same for any src that is -0 or +0
            SetSymIsUsedOnlyInNumberIfLastUse(instr->GetSrc1());
            SetSymIsUsedOnlyInNumberIfLastUse(instr->GetSrc2());
            break;
        default:
            SetSymIsNotUsedOnlyInNumber(instr->GetSrc1());
            SetSymIsNotUsedOnlyInNumber(instr->GetSrc2());
            break;
        }
    }
}